

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedConstructorCode
          (MessageGenerator *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  undefined1 auVar1 [8];
  bool bVar2;
  Sub *local_280;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  undefined1 local_231;
  anon_class_16_2_fd512ddd_for_cb local_230;
  allocator<char> local_219;
  string local_218;
  anon_class_16_2_fd512ddd_for_cb local_1f8 [2];
  allocator<char> local_1d1;
  string local_1d0;
  Sub *local_1b0;
  Sub local_1a8;
  Sub local_f0;
  iterator local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_28;
  undefined1 local_18 [8];
  Printer *p_local;
  MessageGenerator *this_local;
  
  local_18 = (undefined1  [8])p;
  p_local = (Printer *)this;
  bVar2 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  auVar1 = local_18;
  if (!bVar2) {
    local_231 = 1;
    local_1b0 = &local_1a8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"init_impl",&local_1d1);
    local_1f8[0].p = (Printer **)local_18;
    local_1f8[0].this = this;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedConstructorCode(google::protobuf::io::Printer*)::__0>
              (&local_1a8,&local_1d0,local_1f8);
    local_1b0 = &local_f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"zero_init",&local_219);
    local_230.p = (Printer **)local_18;
    local_230.this = this;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedConstructorCode(google::protobuf::io::Printer*)::__1>
              (&local_f0,&local_218,&local_230);
    local_231 = 0;
    local_38 = &local_1a8;
    local_30 = 2;
    v._M_len = 2;
    v._M_array = local_38;
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_28._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_248,
               "\n            inline PROTOBUF_NDEBUG_INLINE $classname$::Impl_::Impl_(\n                $pbi$::InternalVisibility visibility,\n                ::$proto_ns$::Arena* arena)\n                //~\n                $init_impl$ {}\n\n            inline void $classname$::SharedCtor(::_pb::Arena* arena) {\n              new (&_impl_) Impl_(internal_visibility(), arena);\n              $zero_init$;\n            }\n          "
              );
    io::Printer::SourceLocation::current();
    google::protobuf::io::Printer::Emit
              (auVar1,local_28._M_allocated_capacity,local_28._8_8_,local_248._M_len,
               local_248._M_str);
    local_280 = (Sub *)&local_38;
    do {
      local_280 = local_280 + -1;
      io::Printer::Sub::~Sub(local_280);
    } while (local_280 != &local_1a8);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator(&local_219);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSharedConstructorCode(io::Printer* p) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;

  // Generate Impl_::Imp_(visibility, Arena*);
  p->Emit({{"init_impl", [&] { GenerateImplMemberInit(p, InitType::kArena); }},
           {"zero_init", [&] { GenerateZeroInitFields(p); }}},
          R"cc(
            inline PROTOBUF_NDEBUG_INLINE $classname$::Impl_::Impl_(
                $pbi$::InternalVisibility visibility,
                ::$proto_ns$::Arena* arena)
                //~
                $init_impl$ {}

            inline void $classname$::SharedCtor(::_pb::Arena* arena) {
              new (&_impl_) Impl_(internal_visibility(), arena);
              $zero_init$;
            }
          )cc");
}